

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_runner_platform.c
# Opt level: O0

void run_test_in_its_own_process(TestSuite *suite,CgreenTest *test,TestReporter *reporter)

{
  int iVar1;
  uint32_t end_time_in_milliseconds;
  uint32_t uVar2;
  char *pcVar3;
  long in_RDX;
  int *in_RSI;
  char buf [128];
  int sig;
  int status;
  uint32_t test_starting_milliseconds;
  CgreenTest *in_stack_ffffffffffffff48;
  char *__s;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  char local_a8 [132];
  uint local_24;
  uint local_20;
  uint32_t local_1c;
  long local_18;
  int *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_1c = cgreen_time_get_current_milliseconds();
  (**(code **)(local_18 + 0x10))(local_18,*(undefined8 *)(local_10 + 4));
  if (*local_10 == 0) {
    iVar1 = in_child_process();
    if (iVar1 == 0) {
      local_20 = wait_for_child_process();
      uVar2 = local_1c;
      end_time_in_milliseconds = cgreen_time_get_current_milliseconds();
      uVar2 = cgreen_time_duration_in_milliseconds(uVar2,end_time_in_milliseconds);
      *(uint32_t *)(local_18 + 0x60) = uVar2;
      if ('\0' < (char)(((byte)local_20 & 0x7f) + 1) >> 1) {
        local_24 = local_20 & 0x7f;
        if (local_24 != 6) {
          __s = local_a8;
          pcVar3 = strsignal(local_24);
          snprintf(__s,0x80,"Test terminated with signal: %s",pcVar3);
          (**(code **)(local_18 + 0x40))
                    (local_18,*(undefined8 *)(local_10 + 8),local_10[10],local_a8);
          return;
        }
        local_24 = 6;
      }
      (**(code **)(local_18 + 0x40))(local_18,*(undefined8 *)(local_10 + 8),local_10[10],0);
    }
    else {
      run_the_test_code((TestSuite *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff48,(TestReporter *)0x1142f2);
      send_reporter_completion_notification((TestReporter *)0x1142ff);
      stop();
    }
  }
  else {
    send_reporter_skipped_notification((TestReporter *)0x114297);
    (**(code **)(local_18 + 0x40))(local_18,*(undefined8 *)(local_10 + 8),local_10[10],0);
  }
  return;
}

Assistant:

void run_test_in_its_own_process(TestSuite *suite, CgreenTest *test, TestReporter *reporter) {
    uint32_t test_starting_milliseconds = cgreen_time_get_current_milliseconds();

    (*reporter->start_test)(reporter, test->name);
    if (test->skip) {
        send_reporter_skipped_notification(reporter);
        (*reporter->finish_test)(reporter, test->filename, test->line, NULL);
    } else if (in_child_process()) {
        run_the_test_code(suite, test, reporter);
        send_reporter_completion_notification(reporter);
        stop();
    } else {
        const int status = wait_for_child_process();
        reporter->duration = cgreen_time_duration_in_milliseconds(test_starting_milliseconds,
                                                                      cgreen_time_get_current_milliseconds());
        if (WIFSIGNALED(status)) {
            /* a C++ exception generates SIGABRT. Only print our special message for other signals. */
            const int sig = WTERMSIG(status);
            if (sig != SIGABRT) {
                char buf[128];
                snprintf(buf, sizeof(buf), "Test terminated with signal: %s", (const char *)strsignal(sig));
                (*reporter->finish_test)(reporter, test->filename, test->line, buf);
                return;
            }
        }

        (*reporter->finish_test)(reporter, test->filename, test->line, NULL);
    }
}